

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O1

void __thiscall
YAML::SingleDocParser::HandleCompactMapWithNoKey(SingleDocParser *this,EventHandler *eventHandler)

{
  deque<YAML::CollectionType::value,std::allocator<YAML::CollectionType::value>> *this_00;
  undefined4 *puVar1;
  Token *pTVar2;
  value local_14;
  
  this_00 = (deque<YAML::CollectionType::value,std::allocator<YAML::CollectionType::value>> *)
            (this->m_pCollectionStack)._M_t.
            super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
            ._M_t.
            super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
            .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl;
  puVar1 = *(undefined4 **)(this_00 + 0x30);
  if (puVar1 == (undefined4 *)(*(long *)(this_00 + 0x40) + -4)) {
    std::deque<YAML::CollectionType::value,std::allocator<YAML::CollectionType::value>>::
    _M_push_back_aux<YAML::CollectionType::value_const&>(this_00,&local_14);
  }
  else {
    *puVar1 = 5;
    *(undefined4 **)(this_00 + 0x30) = puVar1 + 1;
  }
  pTVar2 = Scanner::peek(this->m_scanner);
  (*eventHandler->_vptr_EventHandler[4])(eventHandler,&pTVar2->mark,0);
  Scanner::pop(this->m_scanner);
  HandleNode(this,eventHandler);
  std::deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_>::pop_back
            ((deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_> *)
             (this->m_pCollectionStack)._M_t.
             super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
             ._M_t.
             super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
             .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl);
  return;
}

Assistant:

void SingleDocParser::HandleCompactMapWithNoKey(EventHandler& eventHandler) {
  m_pCollectionStack->PushCollectionType(CollectionType::CompactMap);

  // null key
  eventHandler.OnNull(m_scanner.peek().mark, NullAnchor);

  // grab value
  m_scanner.pop();
  HandleNode(eventHandler);

  m_pCollectionStack->PopCollectionType(CollectionType::CompactMap);
}